

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ransac.c
# Opt level: O3

_Bool find_rotzoom(Correspondence *points,int *indices,int num_indices,double *params)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  bool bVar6;
  undefined1 *puVar7;
  double dVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  double *pdVar12;
  ulong uVar13;
  undefined1 *puVar14;
  double *pdVar15;
  undefined1 *puVar16;
  int i;
  long lVar17;
  ulong uVar18;
  double *pdVar19;
  long lVar20;
  ulong uVar21;
  double dVar22;
  double local_c8 [8];
  double dStack_88;
  double y [4];
  
  puVar14 = &stack0xfffffffffffffff8;
  dStack_88 = 0.0;
  y[0] = 0.0;
  y[1] = 0.0;
  y[2] = 0.0;
  y[3] = 0.0;
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_c8[2] = 0.0;
  local_c8[3] = 0.0;
  if (0 < num_indices) {
    uVar13 = 0;
    do {
      iVar5 = indices[uVar13];
      dVar22 = points[iVar5].rx;
      dVar1 = points[iVar5].ry;
      local_c8[4] = 1.0;
      local_c8[5] = 0.0;
      dVar4 = points[iVar5].x;
      local_c8[7] = points[iVar5].y;
      local_c8[6] = dVar4;
      lVar17 = 0;
      pdVar12 = local_c8 + 8;
      do {
        dVar2 = local_c8[lVar17 + 4];
        lVar20 = 0;
        do {
          dVar8 = local_c8[lVar20 + 5];
          dVar3 = (pdVar12 + lVar20)[1];
          pdVar12[lVar20] = local_c8[lVar20 + 4] * dVar2 + pdVar12[lVar20];
          (pdVar12 + lVar20)[1] = dVar8 * dVar2 + dVar3;
          lVar20 = lVar20 + 2;
        } while (lVar20 != 4);
        lVar17 = lVar17 + 1;
        pdVar12 = pdVar12 + 4;
      } while (lVar17 != 4);
      lVar17 = 0;
      do {
        local_c8[lVar17] = local_c8[lVar17 + 4] * dVar22 + local_c8[lVar17];
        local_c8[lVar17 + 1] = local_c8[lVar17 + 5] * dVar22 + local_c8[lVar17 + 1];
        lVar17 = lVar17 + 2;
      } while (lVar17 != 4);
      local_c8[4] = 0.0;
      local_c8[5] = 1.0;
      local_c8[6] = local_c8[7];
      local_c8[7] = -dVar4;
      lVar17 = 0;
      pdVar12 = local_c8 + 8;
      do {
        dVar22 = local_c8[lVar17 + 4];
        lVar20 = 0;
        do {
          dVar2 = local_c8[lVar20 + 5];
          dVar4 = (pdVar12 + lVar20)[1];
          pdVar12[lVar20] = local_c8[lVar20 + 4] * dVar22 + pdVar12[lVar20];
          (pdVar12 + lVar20)[1] = dVar2 * dVar22 + dVar4;
          lVar20 = lVar20 + 2;
        } while (lVar20 != 4);
        lVar17 = lVar17 + 1;
        pdVar12 = pdVar12 + 4;
      } while (lVar17 != 4);
      lVar17 = 0;
      do {
        local_c8[lVar17] = local_c8[lVar17 + 4] * dVar1 + local_c8[lVar17];
        local_c8[lVar17 + 1] = local_c8[lVar17 + 5] * dVar1 + local_c8[lVar17 + 1];
        lVar17 = lVar17 + 2;
      } while (lVar17 != 4);
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uint)num_indices);
  }
  pdVar12 = local_c8 + 8;
  pdVar15 = y + 3;
  uVar13 = 0;
  do {
    uVar21 = 3;
    puVar7 = &stack0xfffffffffffffff8;
    do {
      puVar16 = puVar7 + -0x20;
      uVar18 = uVar21 - 1;
      if (ABS(y[uVar13 + uVar18 * 4 + -1]) < ABS(y[uVar13 + uVar21 * 4 + -1])) {
        lVar17 = -4;
        do {
          uVar9 = *(undefined8 *)((long)(puVar16 + lVar17 * 8) + 8);
          uVar10 = *(undefined8 *)(puVar7 + lVar17 * 8);
          uVar11 = *(undefined8 *)((long)(puVar7 + lVar17 * 8) + 8);
          *(undefined8 *)(puVar7 + lVar17 * 8) = *(undefined8 *)(puVar16 + lVar17 * 8);
          *(undefined8 *)((long)(puVar7 + lVar17 * 8) + 8) = uVar9;
          *(undefined8 *)(puVar16 + lVar17 * 8) = uVar10;
          *(undefined8 *)((long)(puVar16 + lVar17 * 8) + 8) = uVar11;
          lVar17 = lVar17 + 2;
        } while (lVar17 != 0);
        dVar22 = local_c8[uVar18];
        local_c8[uVar18] = local_c8[uVar21];
        local_c8[uVar21] = dVar22;
      }
      uVar21 = uVar18;
      puVar7 = puVar16;
    } while (uVar13 < uVar18);
    pdVar19 = pdVar15;
    uVar21 = uVar13;
    do {
      if (ABS(y[uVar13 + (long)((int)uVar13 * 4) + -1]) < 1e-16) {
        return false;
      }
      uVar21 = uVar21 + 1;
      dVar22 = -y[uVar13 + uVar21 * 4 + -1] / y[uVar13 + (long)((int)uVar13 * 4) + -1];
      lVar17 = 0;
      do {
        dVar4 = (pdVar12 + lVar17)[1];
        dVar1 = (pdVar19 + lVar17)[1];
        pdVar19[lVar17] = pdVar12[lVar17] * dVar22 + pdVar19[lVar17];
        (pdVar19 + lVar17)[1] = dVar4 * dVar22 + dVar1;
        lVar17 = lVar17 + 2;
      } while (lVar17 != 4);
      local_c8[uVar21] = dVar22 * local_c8[uVar13] + local_c8[uVar21];
      pdVar19 = pdVar19 + 4;
    } while (uVar21 != 3);
    uVar13 = uVar13 + 1;
    pdVar12 = pdVar12 + 4;
    pdVar15 = pdVar15 + 4;
  } while (uVar13 != 3);
  pdVar12 = params + 4;
  lVar17 = 0;
  uVar13 = 4;
  do {
    uVar21 = uVar13 - 1;
    if (ABS(y[uVar21 * 5 + -1]) < 1e-16) {
      return false;
    }
    dVar22 = 0.0;
    if (uVar13 < 4) {
      lVar20 = 0;
      do {
        dVar22 = dVar22 + *(double *)(puVar14 + lVar20 * 8) * pdVar12[lVar20];
        lVar20 = lVar20 + 1;
      } while (lVar17 != lVar20);
    }
    params[uVar21] = (local_c8[uVar21] - dVar22) / y[uVar21 * 5 + -1];
    lVar17 = lVar17 + 1;
    pdVar12 = pdVar12 + -1;
    puVar14 = puVar14 + -0x28;
    bVar6 = 1 < uVar13;
    uVar13 = uVar21;
  } while (bVar6);
  params[4] = -params[3];
  params[5] = params[2];
  return true;
}

Assistant:

static bool find_rotzoom(const Correspondence *points, const int *indices,
                         int num_indices, double *params) {
  const int n = 4;    // Size of least-squares problem
  double mat[4 * 4];  // Accumulator for A'A
  double y[4];        // Accumulator for A'b
  double a[4];        // Single row of A
  double b;           // Single element of b

  least_squares_init(mat, y, n);
  for (int i = 0; i < num_indices; ++i) {
    int index = indices[i];
    const double sx = points[index].x;
    const double sy = points[index].y;
    const double dx = points[index].rx;
    const double dy = points[index].ry;

    a[0] = 1;
    a[1] = 0;
    a[2] = sx;
    a[3] = sy;
    b = dx;
    least_squares_accumulate(mat, y, a, b, n);

    a[0] = 0;
    a[1] = 1;
    a[2] = sy;
    a[3] = -sx;
    b = dy;
    least_squares_accumulate(mat, y, a, b, n);
  }

  // Fill in params[0] .. params[3] with output model
  if (!least_squares_solve(mat, y, params, n)) {
    return false;
  }

  // Fill in remaining parameters
  params[4] = -params[3];
  params[5] = params[2];

  return true;
}